

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-map.c
# Opt level: O0

void move_cursor_relative_map(wchar_t y,wchar_t x)

{
  int iVar1;
  int local_38;
  int local_34;
  wchar_t map_height;
  wchar_t map_width;
  term_conflict *t;
  term *ptStack_20;
  wchar_t j;
  term_conflict *old;
  wchar_t kx;
  wchar_t ky;
  wchar_t x_local;
  wchar_t y_local;
  
  kx = x;
  ky = y;
  for (t._4_4_ = 0; t._4_4_ < 8; t._4_4_ = t._4_4_ + 1) {
    _map_height = (term_conflict *)angband_term[t._4_4_];
    if ((_map_height != (term_conflict *)0x0) && ((window_flag[t._4_4_] & 0xa0) != 0)) {
      if ((window_flag[t._4_4_] & 0x20) == 0) {
        old._4_4_ = ky - _map_height->offset_y;
        if (1 < tile_height) {
          old._4_4_ = (uint)tile_height * old._4_4_;
        }
        old._0_4_ = kx - _map_height->offset_x;
        if (1 < tile_width) {
          old._0_4_ = (uint)tile_width * (wchar_t)old;
        }
      }
      else {
        get_minimap_dimensions
                  (_map_height,(chunk *)cave,(uint)tile_width,(uint)tile_height,&local_34,&local_38)
        ;
        iVar1 = (ky * local_38) / cave->height;
        if (1 < tile_height) {
          iVar1 = iVar1 - iVar1 % (int)(uint)tile_height;
        }
        old._4_4_ = iVar1 + L'\x01';
        iVar1 = (kx * local_34) / cave->width;
        if (1 < tile_width) {
          iVar1 = iVar1 - iVar1 % (int)(uint)tile_width;
        }
        old._0_4_ = iVar1 + L'\x01';
      }
      if ((((L'\xffffffff' < old._4_4_) && (old._4_4_ < _map_height->hgt)) &&
          (L'\xffffffff' < (wchar_t)old)) && ((wchar_t)old < _map_height->wid)) {
        ptStack_20 = Term;
        Term_activate((term *)_map_height);
        Term_gotoxy((wchar_t)old,old._4_4_);
        Term_activate(ptStack_20);
      }
    }
  }
  return;
}

Assistant:

static void move_cursor_relative_map(int y, int x)
{
	int ky, kx;

	term *old;

	int j;

	/* Scan windows */
	for (j = 0; j < ANGBAND_TERM_MAX; j++) {
		term *t = angband_term[j];

		/* No window */
		if (!t) continue;

		/* No relevant flags */
		if (!(window_flag[j] & (PW_MAPS))) continue;

		if (window_flag[j] & PW_MAP) {
			/* Be consistent with display_map(). */
			int map_width, map_height;

			get_minimap_dimensions(t, cave, tile_width,
				tile_height, &map_width, &map_height);

			ky = (y * map_height) / cave->height;
			if (tile_height > 1) {
				ky = ky - (ky % tile_height) + 1;
			} else {
				++ky;
			}
			kx = (x * map_width) / cave->width;
			if (tile_width > 1) {
				kx = kx - (kx % tile_width) + 1;
			} else {
				++kx;
			}
		} else {
			/* Location relative to panel */
			ky = y - t->offset_y;
			if (tile_height > 1)
				ky = tile_height * ky;

			kx = x - t->offset_x;
			if (tile_width > 1)
				kx = tile_width * kx;
		}

		/* Verify location */
		if ((ky < 0) || (ky >= t->hgt)) continue;
		if ((kx < 0) || (kx >= t->wid)) continue;

		/* Go there */
		old = Term;
		Term_activate(t);
		(void)Term_gotoxy(kx, ky);
		Term_activate(old);
	}
}